

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacketbuilder.cpp
# Opt level: O1

uint32_t __thiscall
jrtplib::RTPPacketBuilder::CreateNewSSRC(RTPPacketBuilder *this,RTPSources *sources)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  
  do {
    uVar2 = (*this->rtprnd->_vptr_RTPRandom[4])();
    this->ssrc = uVar2;
    bVar1 = RTPSources::GotEntry(sources,uVar2);
  } while (bVar1);
  uVar2 = (*this->rtprnd->_vptr_RTPRandom[4])();
  this->timestamp = uVar2;
  iVar3 = (*this->rtprnd->_vptr_RTPRandom[3])();
  this->seqnr = (uint16_t)iVar3;
  this->numpayloadbytes = 0;
  this->numpackets = 0;
  return this->ssrc;
}

Assistant:

uint32_t RTPPacketBuilder::CreateNewSSRC(RTPSources &sources)
{
	bool found;
	
	do
	{
		ssrc = rtprnd.GetRandom32();
		found = sources.GotEntry(ssrc);
	} while (found);
	
	timestamp = rtprnd.GetRandom32();
	seqnr = rtprnd.GetRandom16();

	// p 38: the count SHOULD be reset if the sender changes its SSRC identifier
	numpayloadbytes = 0;
	numpackets = 0;
	return ssrc;
}